

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_loader.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::loadOBJ(embree *this,FileName *fileName,bool subdivMode,bool combineIntoSingleObject)

{
  OBJLoader loader;
  OBJLoader local_168;
  
  OBJLoader::OBJLoader(&local_168,fileName,subdivMode,combineIntoSingleObject);
  *(GroupNode **)this = local_168.group.ptr;
  if (local_168.group.ptr != (GroupNode *)0x0) {
    (*((local_168.group.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  OBJLoader::~OBJLoader(&local_168);
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> loadOBJ(const FileName& fileName, const bool subdivMode, const bool combineIntoSingleObject) {
    OBJLoader loader(fileName,subdivMode,combineIntoSingleObject); 
    return loader.group.cast<SceneGraph::Node>();
  }